

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

int64 __thiscall TTD::EventLog::GetKthEventTimeInLog(EventLog *this,uint32 k)

{
  bool bVar1;
  int64 iVar2;
  uint32 uVar3;
  undefined1 local_40 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_40,&this->m_eventList);
  if (local_40 != (undefined1  [8])0x0) {
    uVar3 = 0;
    do {
      if (iter.m_currLink < *(TTEventListLink **)((long)local_40 + 8)) {
        return -1;
      }
      if ((TTEventListLink *)*(size_t *)local_40 <= iter.m_currLink) {
        return -1;
      }
      bVar1 = NSLogEvents::IsJsRTActionRootCall
                        ((EventLogEntry *)
                         (*(byte **)((long)local_40 + 0x10) + (long)&(iter.m_currLink)->CurrPos));
      if ((bVar1) && (uVar3 = uVar3 + 1, uVar3 == k)) {
        if ((local_40 != (undefined1  [8])0x0) &&
           ((*(TTEventListLink **)((long)local_40 + 8) <= iter.m_currLink &&
            (iter.m_currLink < (TTEventListLink *)*(size_t *)local_40)))) {
          iVar2 = NSLogEvents::GetTimeFromRootCallOrSnapshot
                            ((EventLogEntry *)
                             (*(byte **)((long)local_40 + 0x10) + (long)&(iter.m_currLink)->CurrPos)
                            );
          return iVar2;
        }
        TTDAbort_unrecoverable_error("Iterator is invalid!!!");
      }
      TTEventList::Iterator::MoveNext((Iterator *)local_40);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return -1;
}

Assistant:

int64 EventLog::GetKthEventTimeInLog(uint32 k) const
    {
        uint32 topLevelCount = 0;
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                topLevelCount++;

                if(topLevelCount == k)
                {
                    return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
                }
            }
        }

        return -1;
    }